

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

bool __thiscall
iDynTree::Model::getInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  PointerType ptr;
  pointer pLVar4;
  long lVar5;
  ulong uVar6;
  Vector10 inertiaParamsBuf;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar2 = iDynTree::VectorDynSize::size();
  if (lVar2 != ((long)(this->links).
                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->links).
                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x4924924924924926) {
    iDynTree::VectorDynSize::resize((ulong)modelInertialParams);
  }
  pLVar4 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar4) {
    lVar5 = 0x40;
    lVar2 = 0;
    uVar6 = 0;
    do {
      Link::inertia((Link *)((long)(pLVar4->m_inertia).m_mcom + lVar2 + -0x10));
      iDynTree::SpatialInertia::asVector();
      lVar3 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      puVar1 = (undefined8 *)(lVar3 + -0x40 + lVar5);
      *puVar1 = local_88;
      puVar1[1] = uStack_80;
      puVar1 = (undefined8 *)(lVar3 + -0x30 + lVar5);
      *puVar1 = local_78;
      puVar1[1] = uStack_70;
      puVar1 = (undefined8 *)(lVar3 + -0x20 + lVar5);
      *puVar1 = local_68;
      puVar1[1] = uStack_60;
      puVar1 = (undefined8 *)(lVar3 + -0x10 + lVar5);
      *puVar1 = local_58;
      puVar1[1] = uStack_50;
      *(undefined8 *)(lVar3 + lVar5) = local_48;
      ((undefined8 *)(lVar3 + lVar5))[1] = uStack_40;
      uVar6 = uVar6 + 1;
      pLVar4 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x70;
      lVar5 = lVar5 + 0x50;
    } while (uVar6 < (ulong)(((long)(this->links).
                                    super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 4)
                            * 0x6db6db6db6db6db7));
  }
  return true;
}

Assistant:

bool Model::getInertialParameters(VectorDynSize& modelInertialParams) const
{
    // Resize vector if necessary
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        modelInertialParams.resize(10*this->getNrOfLinks());
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf = links[linkIdx].inertia().asVector();

        toEigen(modelInertialParams).segment<10>(10*linkIdx) = toEigen(inertiaParamsBuf);
    }

    return true;
}